

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O3

int gzdirect(gzFile file)

{
  int iVar1;
  
  iVar1 = 0;
  if ((file != (gzFile)0x0) && (*file == 0x1c4f)) {
    if ((*(int *)((long)file + 0x50) == 0) && (*(int *)((long)file + 0x38) == 0)) {
      gz_head((gz_statep)file);
    }
    iVar1 = *(int *)((long)file + 0x54);
  }
  return iVar1;
}

Assistant:

int ZEXPORT gzdirect(gzFile file)
{
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;

    /* check that we're reading */
    if (state->mode != GZ_READ)
        return 0;

    /* if the state is not known, but we can find out, then do so (this is
       mainly for right after a gzopen() or gzdopen()) */
    if (state->how == LOOK && state->have == 0)
        (void)gz_head(state);

    /* return 1 if reading direct, 0 if decompressing a gzip stream */
    return state->direct;
}